

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arc.cpp
# Opt level: O2

void arc_mask_proc(Am_Object *self,Am_Drawonable *drawonable,int x_offset,int y_offset)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  Am_Value *pAVar7;
  undefined4 extraout_var;
  Am_Style fs;
  Am_Style ls;
  
  pAVar7 = Am_Object::Get(self,100,0);
  iVar1 = Am_Value::operator_cast_to_int(pAVar7);
  pAVar7 = Am_Object::Get(self,0x65,0);
  iVar2 = Am_Value::operator_cast_to_int(pAVar7);
  pAVar7 = Am_Object::Get(self,0x66,0);
  uVar3 = Am_Value::operator_cast_to_int(pAVar7);
  pAVar7 = Am_Object::Get(self,0x67,0);
  uVar4 = Am_Value::operator_cast_to_int(pAVar7);
  pAVar7 = Am_Object::Get(self,0xa7,0);
  iVar5 = Am_Value::operator_cast_to_int(pAVar7);
  pAVar7 = Am_Object::Get(self,0xa8,0);
  uVar6 = Am_Value::operator_cast_to_int(pAVar7);
  pAVar7 = Am_Object::Get(self,0x6b,0);
  Am_Style::Am_Style(&ls,pAVar7);
  pAVar7 = Am_Object::Get(self,0x6a,0);
  Am_Style::Am_Style(&fs,pAVar7);
  if (0 < (int)uVar4 && 0 < (int)uVar3) {
    (*drawonable->_vptr_Am_Drawonable[0x26])
              (drawonable,&ls,&fs,(ulong)(uint)(iVar1 + x_offset),(ulong)(uint)(iVar2 + y_offset),
               (ulong)uVar3,(ulong)uVar4,CONCAT44(extraout_var,iVar5),(ulong)uVar6,7,1);
  }
  Am_Style::~Am_Style(&fs);
  Am_Style::~Am_Style(&ls);
  return;
}

Assistant:

Am_Define_Method(Am_Draw_Method, void, arc_mask,
                 (Am_Object self, Am_Drawonable *drawonable, int x_offset,
                  int y_offset))
{
  int left = (int)self.Get(Am_LEFT) + x_offset;
  int top = (int)self.Get(Am_TOP) + y_offset;
  int width = self.Get(Am_WIDTH);
  int height = self.Get(Am_HEIGHT);
  int angle1 = self.Get(Am_ANGLE1);
  int angle2 = self.Get(Am_ANGLE2);
  Am_Style ls = self.Get(Am_LINE_STYLE);
  Am_Style fs = self.Get(Am_FILL_STYLE);
  if ((width > 0) && (height > 0))
    drawonable->Draw_Arc(ls, fs, left, top, width, height, angle1, angle2,
                         Am_DRAW_MASK_COPY);
}